

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

void Internal_DimStyleDefaultInit(ON_DimStyle *ds)

{
  undefined8 uVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_58;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_54;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_50;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_4c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_48;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_44;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_40;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_3c;
  undefined1 local_38 [8];
  ON_TextMask tm;
  ON_DimStyle *ds_local;
  
  tm.m_content_hash.m_digest._12_8_ = ds;
  ON_DimStyle::SetExtExtension(ds,0.5);
  ON_DimStyle::SetExtOffset((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.5);
  ON_DimStyle::SetArrowSize((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetLeaderArrowSize((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetCenterMark((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.5);
  ON_DimStyle::SetCenterMarkStyle((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Mark);
  ON_DimStyle::SetTextGap((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.25);
  ON_DimStyle::SetTextHeight((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetDimTextLocation((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,AboveDimLine);
  ON_DimStyle::SetDimRadialTextLocation((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,InDimLine);
  ON_DimStyle::SetAngleFormat((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,DecimalDegrees);
  ON_DimStyle::SetAngleResolution((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,2);
  ON_DimStyle::SetDimensionLengthDisplay
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,ModelUnits);
  ON_DimStyle::SetAlternateDimensionLengthDisplay
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,ModelUnits);
  ON_DimStyle::SetLengthResolution((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,2);
  ON_DimStyle::SetAlternateLengthResolution((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,2);
  ON_DimStyle::SetLengthFactor((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetAlternateLengthFactor((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetAlternate((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetForceDimLine((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,true);
  ON_DimStyle::SetDecimalSeparator((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,L'.');
  ON_DimStyle::SetPrefix((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,L"");
  ON_DimStyle::SetSuffix((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,L"");
  ON_DimStyle::SetAlternatePrefix((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,L" [");
  ON_DimStyle::SetAlternateSuffix((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,L"]");
  ON_DimStyle::SetDimExtension((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetSuppressExtension1((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetSuppressExtension2((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetToleranceFormat((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,None);
  ON_DimStyle::SetToleranceResolution((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,4);
  ON_DimStyle::SetToleranceUpperValue((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetToleranceLowerValue((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetToleranceHeightScale((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetBaselineSpacing((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,3.0);
  ON_TextMask::ON_TextMask((ON_TextMask *)local_38);
  ON_DimStyle::SetTextMask((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,(ON_TextMask *)local_38)
  ;
  ON_DimStyle::SetDimScaleSource((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0);
  ON_DimStyle::SetExtensionLineColorSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,color_from_layer);
  ON_DimStyle::SetDimensionLineColorSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,color_from_layer);
  ON_DimStyle::SetArrowColorSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,color_from_layer);
  ON_DimStyle::SetTextColorSource((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,color_from_layer)
  ;
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_3c,0);
  ON_DimStyle::SetExtensionLineColor((ON_DimStyle *)uVar1,(ON_Color)local_3c);
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_40,0);
  ON_DimStyle::SetDimensionLineColor((ON_DimStyle *)uVar1,(ON_Color)local_40);
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_44,0);
  ON_DimStyle::SetArrowColor((ON_DimStyle *)uVar1,(ON_Color)local_44);
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_48,0);
  ON_DimStyle::SetTextColor((ON_DimStyle *)uVar1,(ON_Color)local_48);
  ON_DimStyle::SetExtensionLinePlotColorSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,plot_color_from_layer);
  ON_DimStyle::SetDimensionLinePlotColorSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,plot_color_from_layer);
  ON_DimStyle::SetArrowPlotColorSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,plot_color_from_layer);
  ON_DimStyle::SetTextPlotColorSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,color_from_layer);
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_4c,0);
  ON_DimStyle::SetExtensionLinePlotColor((ON_DimStyle *)uVar1,(ON_Color)local_4c);
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_50,0);
  ON_DimStyle::SetDimensionLinePlotColor((ON_DimStyle *)uVar1,(ON_Color)local_50);
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_54,0);
  ON_DimStyle::SetArrowPlotColor((ON_DimStyle *)uVar1,(ON_Color)local_54);
  uVar1 = tm.m_content_hash.m_digest._12_8_;
  ON_Color::ON_Color((ON_Color *)&local_58,0);
  ON_DimStyle::SetTextPlotColor((ON_DimStyle *)uVar1,(ON_Color)local_58);
  ON_DimStyle::SetExtensionLinePlotWeightSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,plot_weight_from_layer);
  ON_DimStyle::SetDimensionLinePlotWeightSource
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,plot_weight_from_layer);
  ON_DimStyle::SetExtensionLinePlotWeight((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetDimensionLinePlotWeight((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetFixedExtensionLen((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetFixedExtensionLenOn((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetTextRotation((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetAlternateLengthResolution((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,4);
  ON_DimStyle::SetToleranceHeightScale((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.6);
  ON_DimStyle::SetSuppressArrow1((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetSuppressArrow2((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetTextMoveLeader((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0);
  ON_DimStyle::SetArcLengthSymbol((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0);
  ON_DimStyle::SetStackHeightScale((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.7);
  ON_DimStyle::SetStackFractionFormat
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,StackHorizontal);
  ON_DimStyle::SetAlternateRoundOff((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetRoundOff((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetAngleRoundOff((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetZeroSuppress((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,None);
  ON_DimStyle::SetAlternateZeroSuppress((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,None);
  ON_DimStyle::SetAngleZeroSuppress((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,None);
  ON_DimStyle::SetAlternateBelow((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetArrowType1((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,SolidTriangle);
  ON_DimStyle::SetArrowType2((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,SolidTriangle);
  ON_DimStyle::SetLeaderArrowType((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,SolidTriangle);
  ON_DimStyle::SetTextVerticalAlignment((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Top);
  ON_DimStyle::SetTextHorizontalAlignment((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Left);
  ON_DimStyle::SetLeaderTextVerticalAlignment
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,MiddleOfTop);
  ON_DimStyle::SetLeaderTextHorizontalAlignment
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Left);
  ON_DimStyle::SetLeaderContentAngleStyle
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Horizontal);
  ON_DimStyle::SetLeaderCurveType((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Polyline);
  ON_DimStyle::SetLeaderContentAngleRadians((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,0.0);
  ON_DimStyle::SetLeaderHasLanding((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  ON_DimStyle::SetLeaderLandingLength((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetDrawForward((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,true);
  ON_DimStyle::SetSignedOrdinate((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,true);
  ON_DimStyle::SetDimScale((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,1.0);
  ON_DimStyle::SetUnitSystem((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,None);
  ON_DimStyle::SetTextOrientation((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,InPlane);
  ON_DimStyle::SetLeaderTextOrientation((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,InPlane);
  ON_DimStyle::SetDimTextOrientation((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,InPlane);
  ON_DimStyle::SetDimRadialTextOrientation((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,InPlane)
  ;
  ON_DimStyle::SetDimTextAngleStyle((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Aligned);
  ON_DimStyle::SetDimRadialTextAngleStyle
            ((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,Horizontal);
  ON_DimStyle::SetTextUnderlined((ON_DimStyle *)tm.m_content_hash.m_digest._12_8_,false);
  return;
}

Assistant:

static void Internal_DimStyleDefaultInit(ON_DimStyle& ds)
{
  ds.SetExtExtension                     (0.5);
  ds.SetExtOffset                        (0.5);
  ds.SetArrowSize                        (1.0);
  ds.SetLeaderArrowSize                  (1.0);
  ds.SetCenterMark                       (0.5);
  ds.SetCenterMarkStyle                  (ON_DimStyle::centermark_style::Mark);
  ds.SetTextGap                          (0.25);
  ds.SetTextHeight                       (1.0);
  ds.SetDimTextLocation                  (ON_DimStyle::TextLocation::AboveDimLine);
  ds.SetDimRadialTextLocation            (ON_DimStyle::TextLocation::InDimLine);
  ds.SetAngleFormat                      (ON_DimStyle::angle_format::DecimalDegrees);
  ds.SetAngleResolution                  (2);
  ds.SetDimensionLengthDisplay           (ON_DimStyle::LengthDisplay::ModelUnits);
  ds.SetAlternateDimensionLengthDisplay  (ON_DimStyle::LengthDisplay::ModelUnits);
  ds.SetLengthResolution                 (2);
  ds.SetAlternateLengthResolution        (2);
  ds.SetLengthFactor                     (1.0);
  ds.SetAlternateLengthFactor            (1.0);
  ds.SetAlternate                        (false);
  ds.SetForceDimLine                     (true);
  ds.SetDecimalSeparator                 (L'.');
  ds.SetPrefix                           (L"");
  ds.SetSuffix                           (L"");
  ds.SetAlternatePrefix                  (L" [");
  ds.SetAlternateSuffix                  (L"]");
  ds.SetDimExtension                     (0.0);
  ds.SetSuppressExtension1               (false);
  ds.SetSuppressExtension2               (false);
  ds.SetToleranceFormat                  (ON_DimStyle::tolerance_format::None);
  ds.SetToleranceResolution              (4);
  ds.SetToleranceUpperValue              (0.0);
  ds.SetToleranceLowerValue              (0.0);
  ds.SetToleranceHeightScale             (1.0);
  ds.SetBaselineSpacing                  (3.0);
     ON_TextMask tm;
  ds.SetTextMask                         (tm);
  ds.SetDimScaleSource                   (0);
  ds.SetExtensionLineColorSource         (ON::object_color_source::color_from_layer);
  ds.SetDimensionLineColorSource         (ON::object_color_source::color_from_layer);
  ds.SetArrowColorSource                 (ON::object_color_source::color_from_layer);
  ds.SetTextColorSource                  (ON::object_color_source::color_from_layer);
  ds.SetExtensionLineColor               (ON_Color(0));
  ds.SetDimensionLineColor               (ON_Color(0));
  ds.SetArrowColor                       (ON_Color(0));
  ds.SetTextColor                        (ON_Color(0));
  ds.SetExtensionLinePlotColorSource     (ON::plot_color_source::plot_color_from_layer);
  ds.SetDimensionLinePlotColorSource     (ON::plot_color_source::plot_color_from_layer);
  ds.SetArrowPlotColorSource             (ON::plot_color_source::plot_color_from_layer);
  ds.SetTextPlotColorSource              (ON::object_color_source::color_from_layer);
  ds.SetExtensionLinePlotColor           (ON_Color(0));
  ds.SetDimensionLinePlotColor           (ON_Color(0));
  ds.SetArrowPlotColor                   (ON_Color(0));
  ds.SetTextPlotColor                    (ON_Color(0));
  ds.SetExtensionLinePlotWeightSource    (ON::plot_weight_source::plot_weight_from_layer);
  ds.SetDimensionLinePlotWeightSource    (ON::plot_weight_source::plot_weight_from_layer);
  ds.SetExtensionLinePlotWeight          (0.0);
  ds.SetDimensionLinePlotWeight          (0.0);
  ds.SetFixedExtensionLen                (1.0);
  ds.SetFixedExtensionLenOn              (false);
  ds.SetTextRotation                     (0.0);
  ds.SetAlternateLengthResolution        (4);
  ds.SetToleranceHeightScale             (0.6);
  ds.SetSuppressArrow1                   (false);
  ds.SetSuppressArrow2                   (false);
  ds.SetTextMoveLeader                   (0);
  ds.SetArcLengthSymbol                  (L'\0');
  ds.SetStackHeightScale                 (0.7);
  ds.SetStackFractionFormat              (ON_DimStyle::stack_format::StackHorizontal);
  ds.SetAlternateRoundOff                (0.0);
  ds.SetRoundOff                         (0.0);
  ds.SetAngleRoundOff                    (0.0);
  ds.SetZeroSuppress                     (ON_DimStyle::suppress_zero::None);
  ds.SetAlternateZeroSuppress            (ON_DimStyle::suppress_zero::None);
  ds.SetAngleZeroSuppress                (ON_DimStyle::suppress_zero::None);
  ds.SetAlternateBelow                   (false);
  ds.SetArrowType1                       (ON_Arrowhead::arrow_type::SolidTriangle);
  ds.SetArrowType2                       (ON_Arrowhead::arrow_type::SolidTriangle);
  ds.SetLeaderArrowType                  (ON_Arrowhead::arrow_type::SolidTriangle);
  ds.SetTextVerticalAlignment            (ON::TextVerticalAlignment::Top);
  ds.SetTextHorizontalAlignment          (ON::TextHorizontalAlignment::Left);
  ds.SetLeaderTextVerticalAlignment      (ON::TextVerticalAlignment::MiddleOfTop);
  ds.SetLeaderTextHorizontalAlignment    (ON::TextHorizontalAlignment::Left);
  ds.SetLeaderContentAngleStyle          (ON_DimStyle::ContentAngleStyle::Horizontal);
  ds.SetLeaderCurveType                  (ON_DimStyle::leader_curve_type::Polyline);
  ds.SetLeaderContentAngleRadians        (0.0);
  ds.SetLeaderHasLanding                 (false);
  ds.SetLeaderLandingLength              (1.0);
  ds.SetDrawForward                      (true);
  ds.SetSignedOrdinate                   (true);
  ds.SetDimScale                         (1.0);
  ds.SetUnitSystem                       (ON::LengthUnitSystem::None);
  ds.SetTextOrientation                  (ON::TextOrientation::InPlane);
  ds.SetLeaderTextOrientation            (ON::TextOrientation::InPlane);
  ds.SetDimTextOrientation               (ON::TextOrientation::InPlane);
  ds.SetDimRadialTextOrientation         (ON::TextOrientation::InPlane);
  ds.SetDimTextAngleStyle                (ON_DimStyle::ContentAngleStyle::Aligned);
  ds.SetDimRadialTextAngleStyle          (ON_DimStyle::ContentAngleStyle::Horizontal);
  ds.SetTextUnderlined                   (false);
}